

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_event.c
# Opt level: O0

void PickleEvent_print(Event *event,FILE *file)

{
  PickleEvent *pickle_event;
  FILE *file_local;
  Event *event_local;
  
  if (((event != (Event *)0x0) && (event->event_type == Gherkin_PickleEvent)) &&
     (event != (Event *)0x0)) {
    fprintf((FILE *)file,"{\"pickle\":");
    PicklePrinter_print_pickle((FILE_conflict *)file,(Pickle *)event[1].event_print);
    fprintf((FILE *)file,"}\n");
  }
  return;
}

Assistant:

static void PickleEvent_print(const Event* event, FILE* file) {
    if (!event || event->event_type != Gherkin_PickleEvent) {
        return;
    }
    const PickleEvent* pickle_event = (const PickleEvent*) event;
    if (pickle_event) {
        fprintf(file, "{\"pickle\":");
        PicklePrinter_print_pickle(file, pickle_event->pickle);
        fprintf(file, "}\n");
    }
}